

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall UtestShellPointerArray::reverse(UtestShellPointerArray *this)

{
  UtestShellPointerArray *this_00;
  UtestShellPointerArray *in_RDI;
  size_t j;
  size_t i;
  size_t halfCount;
  UtestShellPointerArray *local_18;
  
  if (in_RDI->count_ != 0) {
    this_00 = (UtestShellPointerArray *)(in_RDI->count_ >> 1);
    for (local_18 = (UtestShellPointerArray *)0x0; local_18 < this_00;
        local_18 = (UtestShellPointerArray *)((long)&local_18->arrayOfTests_ + 1)) {
      swap(in_RDI,(size_t)local_18,(in_RDI->count_ - (long)local_18) - 1);
    }
    relinkTestsInOrder(this_00);
  }
  return;
}

Assistant:

void UtestShellPointerArray::reverse()
{
    if (count_ == 0) return;

    size_t halfCount = count_ / 2;
    for (size_t i = 0; i < halfCount; i++)
    {
        size_t j = count_ - i - 1;
        swap(i, j);
   }
   relinkTestsInOrder();
}